

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdKelvinShadeMode::emulate_mthd(MthdKelvinShadeMode *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint uVar2;
  uint err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  _Var1 = pgraph_in_begin_end(state);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = (uint)((uVar2 & 0xfffffffe) != 0x1d00) | (uint)_Var1 << 2;
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  uVar2 = (uVar2 & 1) << 7 |
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
          0xffffff7f;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b = uVar2;
  pgraph_bundle(state,0x12,0,uVar2,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		switch (val) {
			case 0x1d00:
				break;
			case 0x1d01:
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				insrt(exp.bundle_config_b, 7, 1, val);
				pgraph_bundle(&exp, BUNDLE_CONFIG_B, 0, exp.bundle_config_b, true);
			}
		}
	}